

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O3

Var __thiscall ScriptMemoryDumper::Dump(ScriptMemoryDumper *this)

{
  HeapStats *pHVar1;
  long lVar2;
  uint32 *puVar3;
  size_t *psVar4;
  Recycler *pRVar5;
  uint uVar6;
  HeapInfoManager *this_00;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket;
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket_00;
  BucketType *heapBucket_01;
  uint index;
  size_t sVar7;
  long lVar8;
  
  pRVar5 = this->scriptContext->recycler;
  this_00 = &pRVar5->autoHeap;
  pHVar1 = &this->current;
  sVar7 = 0x10;
  lVar8 = 0;
  do {
    (this->current).totalByteCount = 0;
    *(undefined8 *)&(this->current).finalizeCount = 0;
    *(undefined8 *)&(this->current).activeObjectCount = 0;
    (this->current).activeObjectByteSize = 0;
    pHVar1->pageCount = 0;
    (this->current).objectSize = 0;
    (this->current).freeObjectCount = 0;
    lVar2 = lVar8 + 1;
    heapBucket = &Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)32>
                            (&this_00->defaultHeap,sVar7)->
                  super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>;
    uVar6 = (uint)lVar8;
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
              (this,uVar6,heapBucket);
    heapBucket_00 =
         (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
         Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)0>(&this_00->defaultHeap,sVar7);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
              (this,uVar6,heapBucket_00);
    heapBucket_01 =
         Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)128>(&this_00->defaultHeap,sVar7);
    DumpHeapBucket<SmallAllocationBlockAttributes>(this,uVar6,heapBucket_01);
    SaveCurrentAtIndex(this,uVar6);
    (this->total).pageCount = (this->total).pageCount + (this->current).pageCount;
    puVar3 = &(this->total).activeObjectCount;
    *puVar3 = *puVar3 + (this->current).activeObjectCount;
    psVar4 = &(this->total).activeObjectByteSize;
    *psVar4 = *psVar4 + (this->current).activeObjectByteSize;
    puVar3 = &(this->total).finalizeCount;
    *puVar3 = *puVar3 + (this->current).finalizeCount;
    psVar4 = &(this->total).totalByteCount;
    *psVar4 = *psVar4 + (this->current).totalByteCount;
    puVar3 = &(this->total).freeObjectCount;
    *puVar3 = *puVar3 + (this->current).freeObjectCount;
    sVar7 = sVar7 + 0x10;
    lVar8 = lVar2;
  } while (lVar2 != 0x30);
  sVar7 = 0x310;
  lVar8 = 0;
  do {
    (this->current).totalByteCount = 0;
    *(undefined8 *)&(this->current).finalizeCount = 0;
    *(undefined8 *)&(this->current).activeObjectCount = 0;
    (this->current).activeObjectByteSize = 0;
    pHVar1->pageCount = 0;
    (this->current).objectSize = 0;
    (this->current).freeObjectCount = 0;
    lVar2 = lVar8 + 1;
    uVar6 = Memory::HeapInfo::GetMediumBucketIndex(sVar7);
    index = (uint)lVar8;
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
              (this,index,
               &(pRVar5->autoHeap).defaultHeap.mediumHeapBuckets[uVar6].leafHeapBucket.
                super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>);
    uVar6 = Memory::HeapInfo::GetMediumBucketIndex(sVar7);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
              (this,index,
               (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)
               ((pRVar5->autoHeap).defaultHeap.mediumHeapBuckets + uVar6));
    uVar6 = Memory::HeapInfo::GetMediumBucketIndex(sVar7);
    DumpHeapBucket<MediumAllocationBlockAttributes>
              (this,index,
               &(pRVar5->autoHeap).defaultHeap.mediumHeapBuckets[uVar6].finalizableHeapBucket);
    SaveCurrentAtIndex(this,index + 0x30);
    (this->total).pageCount = (this->total).pageCount + (this->current).pageCount;
    puVar3 = &(this->total).activeObjectCount;
    *puVar3 = *puVar3 + (this->current).activeObjectCount;
    psVar4 = &(this->total).activeObjectByteSize;
    *psVar4 = *psVar4 + (this->current).activeObjectByteSize;
    puVar3 = &(this->total).finalizeCount;
    *puVar3 = *puVar3 + (this->current).finalizeCount;
    psVar4 = &(this->total).totalByteCount;
    *psVar4 = *psVar4 + (this->current).totalByteCount;
    puVar3 = &(this->total).freeObjectCount;
    *puVar3 = *puVar3 + (this->current).freeObjectCount;
    sVar7 = sVar7 + 0x10;
    lVar8 = lVar2;
  } while (lVar2 != 0x1d);
  (this->current).totalByteCount = 0;
  *(undefined8 *)&(this->current).finalizeCount = 0;
  *(undefined8 *)&(this->current).activeObjectCount = 0;
  (this->current).activeObjectByteSize = 0;
  pHVar1->pageCount = 0;
  (this->current).objectSize = 0;
  (this->current).freeObjectCount = 0;
  DumpLargeBucket(this,&(pRVar5->autoHeap).defaultHeap.largeObjectBucket);
  SaveCurrentAsLargeBlock(this);
  (this->total).pageCount = (this->total).pageCount + (this->current).pageCount;
  puVar3 = &(this->total).activeObjectCount;
  *puVar3 = *puVar3 + (this->current).activeObjectCount;
  psVar4 = &(this->total).activeObjectByteSize;
  *psVar4 = *psVar4 + (this->current).activeObjectByteSize;
  puVar3 = &(this->total).finalizeCount;
  *puVar3 = *puVar3 + (this->current).finalizeCount;
  psVar4 = &(this->total).totalByteCount;
  *psVar4 = *psVar4 + (this->current).totalByteCount;
  puVar3 = &(this->total).freeObjectCount;
  *puVar3 = *puVar3 + (this->current).freeObjectCount;
  SaveSummary(this);
  return this->dumpObject;
}

Assistant:

Js::Var ScriptMemoryDumper::Dump()
{
    Recycler* recycler = scriptContext->GetRecycler();
    HeapInfo* heapInfo = recycler->GetDefaultHeapInfo();

    for (uint32 i = 0 ; i < HeapConstants::BucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = (i + 1) * HeapConstants::ObjectGranularity;
        DumpHeapBucket(i, &heapInfo->GetBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (SmallFinalizableHeapBucket *)&heapInfo->GetBucket<FinalizeBit>(sizeCat));
        SaveCurrentAtIndex(i);
        MergeCurrentStats();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint32 i = 0 ; i < HeapConstants::MediumBucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = HeapConstants::MaxSmallObjectSize + ((i + 1) * HeapConstants::ObjectGranularity);

#if SMALLBLOCK_MEDIUM_ALLOC
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (MediumFinalizableHeapBucket *)&heapInfo->GetMediumBucket<FinalizeBit>(sizeCat));
#else
        DumpLargeBucket(&heapInfo->GetMediumBucket(sizeCat));
#endif
        SaveCurrentAtIndex(i + HeapConstants::BucketCount);
        MergeCurrentStats();
    }
#endif

    ResetCurrentStats();
    DumpLargeBucket(&heapInfo->largeObjectBucket);
    SaveCurrentAsLargeBlock();
    MergeCurrentStats();
    SaveSummary();
    return dumpObject;
}